

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<void_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_*(unsigned_long)>::With
          (FunctionMocker<void_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  MockSpec<void_*(unsigned_long)> *pMVar1;
  tuple<testing::Matcher<unsigned_long>_> local_30;
  Matcher<unsigned_long> *local_18;
  Matcher<unsigned_long> *m1_local;
  FunctionMocker<void_*(unsigned_long)> *this_local;
  
  local_18 = m1;
  m1_local = (Matcher<unsigned_long> *)this;
  pMVar1 = FunctionMockerBase<void_*(unsigned_long)>::current_spec
                     (&this->super_FunctionMockerBase<void_*(unsigned_long)>);
  std::make_tuple<testing::Matcher<unsigned_long>const&>(&local_30,local_18);
  MockSpec<void_*(unsigned_long)>::SetMatchers(pMVar1,&local_30);
  std::tuple<testing::Matcher<unsigned_long>_>::~tuple(&local_30);
  pMVar1 = FunctionMockerBase<void_*(unsigned_long)>::current_spec
                     (&this->super_FunctionMockerBase<void_*(unsigned_long)>);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }